

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt-fuzz.cpp
# Opt level: O2

void anon_unknown.dwarf_232db::makeArg
               (int W,vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *ArgsTy,
               vector<llvm::Type_*,_std::allocator<llvm::Type_*>_> *RealArgsTy)

{
  undefined8 uVar1;
  Twine *pTVar2;
  Twine *pTVar3;
  uint uVar4;
  Child local_58 [2];
  
  uVar4 = W;
  if (W < (int)(anonymous_namespace)::Promote._128_4_) {
    uVar4 = (anonymous_namespace)::Promote._128_4_;
  }
  if ((anonymous_namespace)::Promote._128_4_ == -1) {
    uVar4 = W;
  }
  local_58[0]._0_8_ = llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,W);
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)ArgsTy,(Type **)&local_58[0].twine);
  pTVar2 = (Twine *)llvm::Type::getIntNTy((LLVMContext *)&(anonymous_namespace)::C,uVar4);
  local_58[0]._0_8_ = pTVar2;
  std::vector<llvm::Type*,std::allocator<llvm::Type*>>::emplace_back<llvm::Type*>
            ((vector<llvm::Type*,std::allocator<llvm::Type*>> *)RealArgsTy,
             (Type **)&local_58[0].twine);
  if ((anonymous_namespace)::ArgsFromMem[0x80] == '\x01') {
    pTVar3 = (Twine *)llvm::GlobalVariable::operator_new(0x58);
    uVar1 = (anonymous_namespace)::M;
    llvm::Twine::Twine((Twine *)&local_58[0].ptrAndLength,"");
    llvm::GlobalVariable::GlobalVariable
              ((GlobalVariable *)pTVar3,uVar1,pTVar2,0,0,0,local_58,0,0,0,0);
    local_58[0]._0_8_ = pTVar3;
    std::vector<llvm::Value*,std::allocator<llvm::Value*>>::emplace_back<llvm::Value*>
              ((vector<llvm::Value*,std::allocator<llvm::Value*>> *)(anonymous_namespace)::globs,
               (Value **)&local_58[0].twine);
  }
  return;
}

Assistant:

void makeArg(int W, std::vector<Type *> &ArgsTy,
             std::vector<Type *> &RealArgsTy) {
  int RealW = W;
  if (Promote != -1 && Promote > W)
    RealW = Promote;
  ArgsTy.push_back(IntegerType::getIntNTy(C, W));
  auto T = IntegerType::getIntNTy(C, RealW);
  RealArgsTy.push_back(T);
  if (ArgsFromMem) {
    GlobalVariable *g =
        new GlobalVariable(*M, T, /*isConstant=*/false,
                           /*Linkage=*/GlobalValue::ExternalLinkage,
                           /*Initializer=*/0);
    globs.push_back(g);
  }
}